

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastDivider(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,Vec_Int_t *vRes
                     )

{
  long lVar1;
  uint uVar2;
  uint iData0;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iData1;
  void *__ptr;
  void *__ptr_00;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  int *local_60;
  int *local_58;
  
  vRes->nSize = 0;
  uVar10 = (ulong)(uint)nNum;
  if (0 < nNum) {
    uVar11 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  piVar3 = vRes->pArray;
  __ptr = malloc((long)nNum << 2);
  __ptr_00 = malloc((long)nNum << 2);
  if (nNum != nDiv) {
    __assert_fail("nNum == nDiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                  ,0x247,
                  "void Wlc_BlastDivider(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  if (0 < nNum) {
    lVar1 = uVar10 - 1;
    local_58 = pDiv + -uVar10;
    lVar9 = lVar1;
    local_60 = pDiv;
    do {
      local_58 = local_58 + 1;
      iVar5 = 0;
      if (0 < lVar9) {
        iVar5 = 0;
        lVar12 = lVar1;
        do {
          iVar5 = Gia_ManHashOr(pNew,iVar5,pDiv[lVar12]);
          if (iVar5 == 1) {
            iVar5 = 1;
            break;
          }
          lVar12 = lVar12 + -1;
        } while ((nNum + -1) - lVar9 < lVar12);
      }
      *(int *)((long)__ptr + lVar9 * 4) = iVar5;
      lVar12 = lVar1;
      piVar13 = local_60;
      while (iVar5 != 1) {
        iVar8 = 0;
        if (lVar9 <= lVar12) {
          iVar8 = *piVar13;
        }
        if (piVar3[lVar12] < 0) goto LAB_008a34c6;
        iVar7 = *(int *)((long)__ptr + lVar9 * 4);
        iVar6 = Gia_ManHashAnd(pNew,iVar8,piVar3[lVar12] ^ 1);
        iVar7 = Gia_ManHashMux(pNew,iVar5,iVar7,iVar6);
        *(int *)((long)__ptr + lVar9 * 4) = iVar7;
        iVar8 = Gia_ManHashXor(pNew,iVar8,piVar3[lVar12]);
        iVar5 = Gia_ManHashOr(pNew,iVar5,iVar8);
        if (lVar12 < 1) break;
        lVar12 = lVar12 + -1;
        piVar13 = piVar13 + -1;
      }
      uVar2 = *(uint *)((long)__ptr + lVar9 * 4);
      if ((int)uVar2 < 0) {
LAB_008a34c6:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      *(uint *)((long)__ptr + lVar9 * 4) = uVar2 ^ 1;
      if (uVar2 != 1) {
        uVar11 = 0;
        iVar5 = 0;
        do {
          iData0 = piVar3[uVar11];
          if ((int)iData0 < 0) goto LAB_008a34c6;
          iVar7 = Gia_ManHashMux(pNew,iVar5,iData0 ^ 1,iData0);
          iVar8 = 0;
          if (lVar9 <= (long)uVar11) {
            iVar8 = local_58[uVar11];
          }
          iVar6 = piVar3[uVar11];
          iData1 = Gia_ManHashAnd(pNew,iVar5,iVar8);
          iVar5 = Gia_ManHashOr(pNew,iVar5,iVar8);
          iVar5 = Gia_ManHashMux(pNew,iVar6,iData1,iVar5);
          iVar8 = Gia_ManHashXor(pNew,iVar7,iVar8);
          *(int *)((long)__ptr_00 + uVar11 * 4) = iVar8;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
        if (uVar2 == 0) {
          vRes->nSize = 0;
          if (0 < nNum) {
            uVar11 = 0;
            do {
              Vec_IntPush(vRes,*(int *)((long)__ptr_00 + uVar11 * 4));
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
        }
        else {
          uVar11 = 0;
          do {
            iVar5 = Gia_ManHashMux(pNew,uVar2 ^ 1,*(int *)((long)__ptr_00 + uVar11 * 4),
                                   piVar3[uVar11]);
            piVar3[uVar11] = iVar5;
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
      }
      local_60 = local_60 + 1;
      bVar4 = 0 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar4);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if ((fQuo != 0) && (vRes->nSize = 0, 0 < nNum)) {
    uVar11 = 0;
    do {
      Vec_IntPush(vRes,*(int *)((long)__ptr + uVar11 * 4));
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Wlc_BlastDivider( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int * pQuo  = ABC_ALLOC( int, nNum );
    int * pTemp = ABC_ALLOC( int, nNum );
    int i, j, known, borrow, y_bit, top_bit;
    assert( nNum == nDiv );
    for ( j = nNum - 1; j >= 0; j-- ) 
    {
        known = 0;
        for ( i = nNum - 1; i > nNum - 1 - j; i-- ) 
        {
            known = Gia_ManHashOr( pNew, known, pDiv[i] );
            if( known == 1 ) 
                break;
        }
        pQuo[j] = known;
        for ( i = nNum - 1; i >= 0; i-- ) 
        {
            if ( known == 1 ) 
                break;
            y_bit = (i >= j) ? pDiv[i-j] : 0;
            pQuo[j] = Gia_ManHashMux( pNew, known, pQuo[j], Gia_ManHashAnd( pNew, y_bit, Abc_LitNot(pRes[i]) ) );
            known = Gia_ManHashOr( pNew, known, Gia_ManHashXor(pNew, y_bit, pRes[i]));
        }
        pQuo[j] = Abc_LitNot(pQuo[j]);
        if ( pQuo[j] == 0 )
            continue;
        borrow = 0;
        for ( i = 0; i < nNum; i++ ) 
        {
            top_bit  = Gia_ManHashMux( pNew, borrow, Abc_LitNot(pRes[i]), pRes[i] );
            y_bit    = (i >= j) ? pDiv[i-j] : 0;
            borrow   = Gia_ManHashMux( pNew, pRes[i], Gia_ManHashAnd(pNew, borrow, y_bit), Gia_ManHashOr(pNew, borrow, y_bit) );
            pTemp[i] = Gia_ManHashXor( pNew, top_bit, y_bit );
        }
        if ( pQuo[j] == 1 ) 
            Wlc_VecCopy( vRes, pTemp, nNum );
        else 
            for( i = 0; i < nNum; i++ ) 
                pRes[i] = Gia_ManHashMux( pNew, pQuo[j], pTemp[i], pRes[i] );
    }
    ABC_FREE( pTemp );
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    ABC_FREE( pQuo );
}